

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConstantPadLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint __val;
  bool bVar1;
  int __val_00;
  ConstantPaddingLayerParams *this_01;
  uint64 uVar2;
  uint64 uVar3;
  Result *_result;
  int iVar4;
  int index;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  index = 1;
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ConstantPad",(allocator<char> *)&err);
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  this_01 = Specification::NeuralNetworkLayer::constantpad(layer);
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
    __val = (this_01->padamounts_).current_size_;
    if ((__val & 1) == 0) {
      if (__val != 0) {
        if (this_01->padtogivenoutputsizemode_ == true) {
          iVar4 = (int)__val >> 1;
          __val_00 = 0;
          if (iVar4 < 1) {
            iVar4 = 0;
            __val_00 = 0;
          }
          for (; iVar4 != __val_00; __val_00 = __val_00 + 1) {
            uVar2 = Specification::ConstantPaddingLayerParams::padamounts(this_01,index + -1);
            uVar3 = Specification::ConstantPaddingLayerParams::padamounts(this_01,index);
            if ((0 < (int)uVar2) && (0 < (int)uVar3)) {
              std::operator+(&local_70,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
              std::operator+(&local_90,&local_70,
                             "\', \'padToGivenOutputSizeMode\' is true, and both padding values corresponding to dimension "
                            );
              std::__cxx11::to_string(&local_b0,__val_00);
              std::operator+(&local_d0,&local_90,&local_b0);
              std::operator+(&err,&local_d0,
                             " are non zero, which is invalid. Only one value can be non-zero.");
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_70);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
              goto LAB_002880b2;
            }
            index = index + 2;
          }
        }
        goto LAB_00287f12;
      }
      std::operator+(&local_d0,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
      std::operator+(&err,&local_d0,
                     "\', length of \'padAmounts\' cannot be zero when only 1 input is provided.");
      std::__cxx11::string::~string((string *)&local_d0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else {
      std::operator+(&local_70,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
      std::operator+(&local_90,&local_70,"\', length of \'padAmounts\' parameter is ");
      std::__cxx11::to_string(&local_b0,__val);
      std::operator+(&local_d0,&local_90,&local_b0);
      std::operator+(&err,&local_d0,", an odd value, which is not allowed.");
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
LAB_002880b2:
    std::__cxx11::string::~string((string *)&err);
  }
  else {
LAB_00287f12:
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConstantPadLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ConstantPad", blobNameToRank));

    const auto& params = layer.constantpad();

    if (layer.input_size() == 1) {
        int len = params.padamounts_size();
        if (len % 2 != 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' parameter is " + std::to_string(len) + ", an odd value, which is not allowed.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (len == 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' cannot be zero when only 1 input is provided.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (params.padtogivenoutputsizemode()) {
            for (int i=0; i < len/2; i++) {
                int pad_a = (int)params.padamounts(2*i);
                int pad_b = (int)params.padamounts(2*i+1);
                if (pad_a > 0 && pad_b > 0) {
                    const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', 'padToGivenOutputSizeMode' is true, and both padding values corresponding to dimension " + std::to_string(i) + " are non zero, which is invalid. Only one value can be non-zero.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}